

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayInstance::createTexture
          (TextureGather2DArrayInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this_00;
  TextureFormat TVar2;
  TextureFormat TVar3;
  TextureGather2DArrayInstance *pTVar4;
  int iVar5;
  deUint32 seed;
  Texture2DArray *pTVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer pPVar9;
  TextureBinding *this_01;
  Context *pCVar10;
  ulong *puVar11;
  long *plVar12;
  size_type *psVar13;
  MessageBuilder *__n;
  pointer pPVar14;
  void *__buf;
  SharedPtrStateBase *extraout_RDX;
  long lVar15;
  PixelBufferAccess *dst;
  long in_RSI;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  TextureBindingSp TVar20;
  string local_3d0;
  string local_3b0;
  long *local_390;
  long local_388;
  long local_380;
  long lStack_378;
  TextureFormat local_370;
  MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> texture;
  string local_350;
  ulong *local_330;
  long local_328;
  ulong local_320 [2];
  TextureGather2DArrayInstance *local_310;
  long local_308;
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  Sampler local_2c0;
  LogImage local_280;
  undefined1 local_1f0 [120];
  ios_base local_178 [264];
  TextureFormatInfo texFmtInfo;
  
  TVar2 = *(TextureFormat *)(**(long **)(in_RSI + 8) + 0x10);
  local_310 = this;
  tcu::getTextureFormatInfo(&texFmtInfo,(TextureFormat *)(in_RSI + 0x218));
  pTVar6 = (Texture2DArray *)operator_new(0x58);
  tcu::Texture2DArray::Texture2DArray
            (pTVar6,(TextureFormat *)(in_RSI + 0x218),*(int *)(in_RSI + 0x264),
             *(int *)(in_RSI + 0x268),*(int *)(in_RSI + 0x26c));
  local_2c0.compare = *(CompareMode *)(in_RSI + 0x220);
  local_2c0._0_8_ = *(undefined8 *)(in_RSI + 0x224);
  local_2c0.wrapR = REPEAT_GL;
  local_2c0._12_8_ = *(undefined8 *)(in_RSI + 0x240);
  local_2c0.lodThreshold = 0.0;
  local_2c0.normalizedCoords = true;
  local_2c0.depthStencilMode = MODE_DEPTH;
  local_2c0._32_8_ = 0;
  local_2c0.borderColor.v._4_5_ = 0;
  local_2c0.borderColor.v.uData[2]._1_3_ = 0;
  local_2c0._48_5_ = 0;
  lVar15 = (long)*(int *)(in_RSI + 0x248);
  iVar5 = (int)((long)(pTVar6->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar6->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
  texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data.ptr
       = pTVar6;
  if (*(int *)(in_RSI + 0x248) < iVar5) {
    paVar1 = &local_3b0.field_2;
    local_308 = (long)iVar5;
    local_370 = TVar2;
    do {
      tcu::Texture2DArray::allocLevel
                (texture.
                 super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
                 m_data.ptr,(int)lVar15);
      dst = ((texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->super_TextureLevelPyramid).m_access.
            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar15;
      seed = tcu::CommandLine::getBaseSeed(*(CommandLine **)(**(long **)(in_RSI + 8) + 0x18));
      fillWithRandomColorTiles(dst,&texFmtInfo.valueMin,&texFmtInfo.valueMax,seed);
      local_3b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"InputTextureLevel","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::ostream::operator<<((MessageBuilder *)local_1f0,(int)lVar15);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0xb28ee1);
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      puVar11 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_3d0.field_2._M_allocated_capacity = *puVar11;
        local_3d0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_3d0.field_2._M_allocated_capacity = *puVar11;
        local_3d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_3d0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_280,&local_3b0,&local_3d0);
      tcu::TestLog::startImageSet
                ((TestLog *)local_370,local_280.m_name._M_dataplus._M_p,
                 local_280.m_description._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
        operator_delete(local_280.m_description._M_dataplus._M_p,
                        local_280.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
        operator_delete(local_280.m_name._M_dataplus._M_p,
                        local_280.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
      if (local_390 != &local_380) {
        operator_delete(local_390,local_380 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if (0 < *(int *)(in_RSI + 0x26c)) {
        iVar5 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
          std::ostream::operator<<((MessageBuilder *)local_1f0,iVar5);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
          std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2e0,0,(char *)0x0,0xb28ecf);
          local_390 = &local_380;
          plVar12 = plVar7 + 2;
          if ((long *)*plVar7 == plVar12) {
            local_380 = *plVar12;
            lStack_378 = plVar7[3];
          }
          else {
            local_380 = *plVar12;
            local_390 = (long *)*plVar7;
          }
          local_388 = plVar7[1];
          *plVar7 = (long)plVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_390);
          local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_3d0.field_2._M_allocated_capacity = *puVar11;
            local_3d0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_3d0.field_2._M_allocated_capacity = *puVar11;
            local_3d0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_3d0._M_string_length = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
          std::ostream::operator<<((MessageBuilder *)local_1f0,iVar5);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
          std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
            uVar16 = local_3d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_328 + local_3d0._M_string_length) {
            uVar17 = 0xf;
            if (local_330 != local_320) {
              uVar17 = local_320[0];
            }
            if (uVar17 < local_328 + local_3d0._M_string_length) goto LAB_006477b4;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_330,0,(char *)0x0,(ulong)local_3d0._M_dataplus._M_p);
          }
          else {
LAB_006477b4:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_330);
          }
          psVar13 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_3b0.field_2._M_allocated_capacity = *psVar13;
            local_3b0.field_2._8_8_ = puVar8[3];
            local_3b0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_3b0.field_2._M_allocated_capacity = *psVar13;
            local_3b0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_3b0._M_string_length = puVar8[1];
          *puVar8 = psVar13;
          puVar8[1] = 0;
          *(undefined1 *)psVar13 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
          std::ostream::operator<<((MessageBuilder *)local_1f0,iVar5);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
          std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_300,0,(char *)0x0,0xb28f4d);
          local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
          psVar13 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_350.field_2._M_allocated_capacity = *psVar13;
            local_350.field_2._8_8_ = plVar7[3];
          }
          else {
            local_350.field_2._M_allocated_capacity = *psVar13;
            local_350._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_350._M_string_length = plVar7[1];
          *plVar7 = (long)psVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          tcu::getSubregion((PixelBufferAccess *)local_1f0,dst,0,0,iVar5,
                            (dst->super_ConstPixelBufferAccess).m_size.m_data[0],
                            (dst->super_ConstPixelBufferAccess).m_size.m_data[1],1);
          __n = (MessageBuilder *)local_1f0;
          tcu::LogImage::LogImage
                    (&local_280,&local_3b0,&local_350,(ConstPixelBufferAccess *)local_1f0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_280,local_370.order,__buf,(size_t)__n);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
            operator_delete(local_280.m_description._M_dataplus._M_p,
                            local_280.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
            operator_delete(local_280.m_name._M_dataplus._M_p,
                            local_280.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
          }
          if (local_300[0] != local_2f0) {
            operator_delete(local_300[0],local_2f0[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
          }
          if (local_330 != local_320) {
            operator_delete(local_330,local_320[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
            operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
          }
          if (local_390 != &local_380) {
            operator_delete(local_390,local_380 + 1);
          }
          if (local_2e0[0] != local_2d0) {
            operator_delete(local_2e0[0],local_2d0[0] + 1);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < *(int *)(in_RSI + 0x26c));
      }
      TVar2 = local_370;
      tcu::TestLog::endImageSet((TestLog *)local_370);
      TVar3 = local_370;
      this_00 = (ostringstream *)(local_1f0 + 8);
      local_370.order = TVar2.order;
      local_370.type = TVar2.type;
      local_1f0._0_4_ = local_370.order;
      local_1f0._4_4_ = local_370.type;
      local_370 = TVar3;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Note: texture level\'s size is ",0x1e);
      local_280.m_name._M_string_length._0_4_ = (dst->super_ConstPixelBufferAccess).m_size.m_data[2]
      ;
      local_280.m_name._M_dataplus._M_p =
           *(pointer *)(dst->super_ConstPixelBufferAccess).m_size.m_data;
      tcu::operator<<((ostream *)this_00,(Vector<int,_3> *)&local_280);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f0 + 8));
      std::ios_base::~ios_base(local_178);
      lVar15 = lVar15 + 1;
    } while (lVar15 != local_308);
  }
  pTVar6 = texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
           m_data.ptr;
  tcu::Texture2DArray::Texture2DArray
            ((Texture2DArray *)local_1f0,
             (TextureFormat *)
             texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
             .m_data.ptr,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_width,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_height,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_numLayers);
  tcu::Texture2DArray::operator=((Texture2DArray *)(in_RSI + 0x288),(Texture2DArray *)local_1f0);
  tcu::Texture3D::~Texture3D((Texture3D *)local_1f0);
  pPVar9 = (pTVar6->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar14 = (pTVar6->super_TextureLevelPyramid).m_access.
            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pPVar14 - (long)pPVar9) >> 3) * -0x33333333) {
    lVar19 = 8;
    lVar15 = 0;
    lVar18 = 0;
    do {
      if (*(long *)((long)&((pTVar6->super_TextureLevelPyramid).m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar19) != 0) {
        tcu::Texture2DArray::allocLevel((Texture2DArray *)(in_RSI + 0x288),(int)lVar18);
        swizzlePixels((PixelBufferAccess *)(*(long *)(in_RSI + 0x2a8) + lVar15),
                      (ConstPixelBufferAccess *)
                      ((long)(((pTVar6->super_TextureLevelPyramid).m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + lVar15 + -8),
                      (MaybeTextureSwizzle *)(in_RSI + 0x22c));
        pPVar9 = (pTVar6->super_TextureLevelPyramid).m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar14 = (pTVar6->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar18 = lVar18 + 1;
      lVar15 = lVar15 + 0x28;
      lVar19 = lVar19 + 0x10;
    } while (lVar18 < (int)((ulong)((long)pPVar14 - (long)pPVar9) >> 3) * -0x33333333);
  }
  this_01 = (TextureBinding *)operator_new(0x68);
  pTVar6 = texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
           m_data.ptr;
  texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data.ptr
       = (Texture2DArray *)0x0;
  TextureBinding::TextureBinding(this_01,pTVar6,&local_2c0);
  pTVar4 = local_310;
  (local_310->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  m_context = (Context *)0x0;
  (local_310->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)this_01;
  pCVar10 = (Context *)operator_new(0x20);
  *(undefined4 *)&pCVar10->m_platformInterface = 0;
  *(undefined4 *)((long)&pCVar10->m_platformInterface + 4) = 0;
  pCVar10->m_testCtx = (TestContext *)&PTR__SharedPtrState_00d2bfc0;
  pCVar10->m_progCollection = (ProgramCollection<vk::ProgramBinary> *)this_01;
  (pTVar4->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.m_context
       = pCVar10;
  *(undefined4 *)&pCVar10->m_platformInterface = 1;
  *(undefined4 *)((long)&pCVar10->m_platformInterface + 4) = 1;
  de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
            (&texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>);
  TVar20.m_state = extraout_RDX;
  TVar20.m_ptr = (TextureBinding *)pTVar4;
  return TVar20;
}

Assistant:

TextureBindingSp TextureGather2DArrayInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2DArray>	texture		= MovePtr<tcu::Texture2DArray>(new tcu::Texture2DArray(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y(), m_textureSize.z()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());

			log << TestLog::ImageSet("InputTextureLevel", "Input texture, level " + de::toString(levelNdx));
			for (int layerNdx = 0; layerNdx < m_textureSize.z(); layerNdx++)
				log << TestLog::Image("InputTextureLevel" + de::toString(layerNdx) + "Layer" + de::toString(layerNdx),
									  "Layer " + de::toString(layerNdx),
									  tcu::getSubregion(level, 0, 0, layerNdx, level.getWidth(), level.getHeight(), 1));
			log << TestLog::EndImageSet
				<< TestLog::Message << "Note: texture level's size is " << IVec3(level.getWidth(), level.getHeight(), level.getDepth()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}